

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::LengthGraphemeFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  FunctionNullHandling in_stack_fffffffffffffe08;
  bind_lambda_function_t in_stack_fffffffffffffe10;
  scalar_function_t local_1e8;
  LogicalType local_1c8;
  LogicalType local_1b0;
  vector<duckdb::LogicalType,_true> local_198;
  LogicalType local_180;
  string local_168;
  ScalarFunction local_148;
  
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"length_grapheme","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  LogicalType::LogicalType(&local_1b0,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_1b0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_198,__l,
             (allocator_type *)&stack0xfffffffffffffe17);
  LogicalType::LogicalType(&local_1c8,BIGINT);
  local_1e8.super__Function_base._M_functor._8_8_ = 0;
  local_1e8.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::string_t,long,duckdb::GraphemeCountOperator>;
  local_1e8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_1e8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_180,INVALID);
  ScalarFunction::ScalarFunction
            (&local_148,&local_198,&local_1c8,&local_1e8,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,LengthPropagateStats,(init_local_state_t)0x0,
             (LogicalType)ZEXT824(&local_180),CONSISTENT,in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe10);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_148);
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_148.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_148.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_148.function.super__Function_base._M_manager)
              ((_Any_data *)&local_148.function,(_Any_data *)&local_148.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_148.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_180);
  if (local_1e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1e8.super__Function_base._M_manager)
              ((_Any_data *)&local_1e8,(_Any_data *)&local_1e8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_1c8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_198);
  LogicalType::~LogicalType(&local_1b0);
  return in_RDI;
}

Assistant:

ScalarFunctionSet LengthGraphemeFun::GetFunctions() {
	ScalarFunctionSet length_grapheme("length_grapheme");
	length_grapheme.AddFunction(ScalarFunction({LogicalType::VARCHAR}, LogicalType::BIGINT,
	                                           ScalarFunction::UnaryFunction<string_t, int64_t, GraphemeCountOperator>,
	                                           nullptr, nullptr, LengthPropagateStats));
	return (length_grapheme);
}